

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O1

IBufferView * __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::GetDefaultView
          (BufferBase<Diligent::EngineVkImplTraits> *this,BUFFER_VIEW_TYPE ViewType)

{
  BufferViewVkImpl *pBVar1;
  int iVar2;
  undefined7 in_register_00000031;
  string msg;
  string local_28;
  
  iVar2 = (int)CONCAT71(in_register_00000031,ViewType);
  if (iVar2 == 2) {
    pBVar1 = (this->m_pDefaultUAV)._M_t.
             super___uniq_ptr_impl<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_Diligent::BufferViewVkImpl_*,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
             .super__Head_base<0UL,_Diligent::BufferViewVkImpl_*,_false>._M_head_impl;
  }
  else if (iVar2 == 1) {
    pBVar1 = (this->m_pDefaultSRV)._M_t.
             super___uniq_ptr_impl<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_Diligent::BufferViewVkImpl_*,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
             .super__Head_base<0UL,_Diligent::BufferViewVkImpl_*,_false>._M_head_impl;
  }
  else {
    FormatString<char[18]>(&local_28,(char (*) [18])"Unknown view type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetDefaultView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pBVar1 = (BufferViewVkImpl *)0x0;
  }
  return (IBufferView *)pBVar1;
}

Assistant:

GetDefaultView(BUFFER_VIEW_TYPE ViewType) override
    {
        switch (ViewType)
        {
            case BUFFER_VIEW_SHADER_RESOURCE: return m_pDefaultSRV.get();
            case BUFFER_VIEW_UNORDERED_ACCESS: return m_pDefaultUAV.get();
            default: UNEXPECTED("Unknown view type"); return nullptr;
        }
    }